

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

void __thiscall QStatusBar::showMessage(QStatusBar *this,QString *message,int timeout)

{
  long lVar1;
  bool bVar2;
  QTimer *this_00;
  long *plVar3;
  long in_FS_OFFSET;
  Object local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  plVar3 = *(long **)(lVar1 + 0x290);
  if (timeout < 1) {
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x20))();
      *(undefined8 *)(lVar1 + 0x290) = 0;
    }
  }
  else {
    if (plVar3 == (long *)0x0) {
      this_00 = (QTimer *)operator_new(0x10);
      QTimer::QTimer(this_00,(QObject *)this);
      *(QTimer **)(lVar1 + 0x290) = this_00;
      QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QStatusBar::*)()>
                (local_40,(offset_in_QTimer_to_subr)this_00,(ContextType *)QTimer::timeout,
                 (offset_in_QStatusBar_to_subr *)0x0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_40);
      plVar3 = *(long **)(lVar1 + 0x290);
    }
    QTimer::start((int)plVar3);
  }
  bVar2 = ::comparesEqual((QString *)(lVar1 + 0x270),message);
  if (!bVar2) {
    QString::operator=((QString *)(lVar1 + 0x270),(QString *)message);
    hideOrShow(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusBar::showMessage(const QString &message, int timeout)
{
    Q_D(QStatusBar);

    if (timeout > 0) {
        if (!d->timer) {
            d->timer = new QTimer(this);
            connect(d->timer, &QTimer::timeout, this, &QStatusBar::clearMessage);
        }
        d->timer->start(timeout);
    } else if (d->timer) {
        delete d->timer;
        d->timer = nullptr;
    }
    if (d->tempItem == message)
        return;
    d->tempItem = message;

    hideOrShow();
}